

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

int * frozen::
      unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
      ::
      at_impl<frozen::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>const&,std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *self,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
                equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  bool bVar1;
  value_type *__x;
  out_of_range *this;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  __x = lookup_impl<frozen::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>const&,std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                  (self,key,hash);
  local_28._M_str = (key->_M_dataplus)._M_p;
  local_28._M_len = key->_M_string_length;
  bVar1 = CLI::std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (equal,&__x->first,&local_28);
  if (bVar1) {
    return &__x->second;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"unknown key");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static inline constexpr auto& at_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto& kv = self.lookup(key, hash);
    if (equal(kv.first, key))
      return kv.second;
    else
      FROZEN_THROW_OR_ABORT(std::out_of_range("unknown key"));
  }